

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  Node *initial_node;
  Edge *pEVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  pointer ppNVar8;
  bool bVar9;
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  vector<Node_*,_std::allocator<Node_*>_> local_98;
  string *local_78;
  _Rb_tree_header *local_70;
  DependencyScan *local_68;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var5 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = err;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  bVar9 = (_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left == p_Var5;
  if (!bVar9) {
    local_70 = &(this->want_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_68 = scan;
    do {
      initial_node = *(Node **)(p_Var6 + 1);
      local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar3 = DependencyScan::RecomputeDirty(scan,initial_node,&local_98,local_78);
      bVar4 = true;
      ppNVar8 = local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (bVar3) {
        for (; bVar3 = ppNVar8 !=
                       local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                       super__Vector_impl_data._M_finish, bVar3; ppNVar8 = ppNVar8 + 1) {
          pEVar1 = (*ppNVar8)->in_edge_;
          if (((pEVar1 != (Edge *)0x0) && (pEVar1->outputs_ready_ == false)) &&
             (bVar4 = AddSubTarget(this,*ppNVar8,(Node *)0x0,local_78,
                                   (set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> *)0x0),
             !bVar4)) break;
        }
        scan = local_68;
        bVar4 = true;
        if ((!bVar3) && (bVar4 = false, initial_node->dirty_ == true)) {
          pEVar1 = initial_node->in_edge_;
          if ((pEVar1 == (Edge *)0x0) || (pEVar1->outputs_ready_ == true)) {
            __assert_fail("edge && !edge->outputs_ready()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,0x19f,
                          "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                         );
          }
          p_Var5 = local_70;
          for (p_Var2 = (this->want_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
              p_Var2 = (&p_Var2->_M_left)[*(Edge **)(p_Var2 + 1) < pEVar1]) {
            if (*(Edge **)(p_Var2 + 1) >= pEVar1) {
              p_Var5 = (_Rb_tree_header *)p_Var2;
            }
          }
          p_Var7 = local_70;
          if ((p_Var5 != local_70) && (p_Var7 = p_Var5, pEVar1 < (Edge *)p_Var5->_M_node_count)) {
            p_Var7 = local_70;
          }
          if (p_Var7 == local_70) {
            __assert_fail("want_e != want_.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,0x1a1,
                          "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                         );
          }
          bVar4 = false;
          if (*(int *)(p_Var7 + 1) == 0) {
            *(undefined4 *)(p_Var7 + 1) = 1;
            this->wanted_edges_ = this->wanted_edges_ + 1;
            bVar3 = Edge::is_phony(pEVar1);
            if (!bVar3) {
              this->command_edges_ = this->command_edges_ + 1;
            }
          }
        }
      }
      if (local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (bVar4) break;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      bVar9 = (_Rb_tree_header *)p_Var6 == &local_60._M_impl.super__Rb_tree_header;
    } while (!bVar9);
  }
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&local_60);
  return bVar9;
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    std::vector<Node*> validation_nodes;
    if (!scan->RecomputeDirty(n, &validation_nodes, err))
      return false;

    // Add any validation nodes found during RecomputeDirty as new top level
    // targets.
    for (std::vector<Node*>::iterator v = validation_nodes.begin();
         v != validation_nodes.end(); ++v) {
      if (Edge* in_edge = (*v)->in_edge()) {
        if (!in_edge->outputs_ready() &&
            !AddTarget(*v, err)) {
          return false;
        }
      }
    }
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}